

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBelief.cpp
# Opt level: O1

double __thiscall
JointBelief::Update(JointBelief *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI,
                   Index newJOI)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  char cVar5;
  ulong uVar6;
  long *plVar7;
  Index prec_sI;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double Pso_ba;
  vector<double,_std::allocator<double>_> newJB_unnorm;
  double local_80;
  double local_78;
  Index local_6c;
  ulong local_68;
  double local_60;
  void *local_58;
  iterator iStack_50;
  double *local_48;
  double local_38;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_58 = (void *)0x0;
  iStack_50._M_current = (double *)0x0;
  local_48 = (double *)0x0;
  local_6c = newJOI;
  uVar6 = (**(code **)((long)*pu + 0x30))(pu);
  plVar7 = (long *)(**(code **)((long)*pu + 0x110))(pu);
  local_68 = uVar6;
  if (plVar7 == (long *)0x0) {
    if (uVar6 != 0) {
      uVar6 = 0;
      local_78 = 0.0;
      do {
        local_80 = 0.0;
        cVar5 = (**(code **)((long)*pu + 0x140))(pu);
        if (cVar5 == '\0') {
          local_38 = (double)(**(code **)((long)*pu + 0x118))(pu,lastJAI,uVar6,local_6c);
          auVar11 = ZEXT816(0);
          uVar8 = 0;
          do {
            local_60 = auVar11._0_8_;
            auVar14._0_8_ = (**(code **)((long)*pu + 0x108))(pu,uVar8,lastJAI,uVar6);
            auVar14._8_56_ = extraout_var_00;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = local_60;
            auVar11._8_8_ = 0;
            auVar11._0_8_ =
                 *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8)) +
                           uVar8 * 8);
            auVar11 = vfmadd231sd_fma(auVar18,auVar14._0_16_,auVar11);
            uVar8 = (ulong)((int)uVar8 + 1);
          } while (uVar8 < local_68);
          local_80 = auVar11._0_8_ * local_38;
        }
        else {
          uVar8 = 0;
          do {
            local_60 = (double)(**(code **)((long)*pu + 0x120))(pu,uVar8,lastJAI,uVar6,local_6c);
            dVar9 = (double)(**(code **)((long)*pu + 0x108))(pu,uVar8,lastJAI,uVar6);
            auVar17._8_8_ = 0;
            auVar17._0_8_ =
                 *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8)) +
                           uVar8 * 8);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_80;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = dVar9 * local_60;
            auVar11 = vfmadd213sd_fma(auVar17,auVar12,auVar3);
            local_80 = auVar11._0_8_;
            uVar8 = (ulong)((int)uVar8 + 1);
          } while (uVar8 < local_68);
        }
        if (iStack_50._M_current == local_48) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_58,iStack_50,&local_80);
        }
        else {
          *iStack_50._M_current = local_80;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        local_78 = local_78 + local_80;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (uVar6 < local_68);
      goto LAB_003f8f45;
    }
  }
  else if (uVar6 != 0) {
    uVar6 = 0;
    local_78 = 0.0;
    do {
      local_80 = 0.0;
      cVar5 = (**(code **)((long)*pu + 0x140))(pu);
      if (cVar5 == '\0') {
        local_38 = (double)(**(code **)((long)*pu + 0x118))(pu,lastJAI,uVar6,local_6c);
        auVar11 = ZEXT816(0);
        uVar8 = 0;
        do {
          local_60 = auVar11._0_8_;
          auVar13._0_8_ = (**(code **)(*plVar7 + 0x10))(plVar7,uVar8,lastJAI,uVar6);
          auVar13._8_56_ = extraout_var;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = local_60;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8))
                                   + uVar8 * 8);
          auVar11 = vfmadd231sd_fma(auVar16,auVar13._0_16_,auVar2);
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (uVar8 < local_68);
        local_80 = auVar11._0_8_ * local_38;
      }
      else {
        uVar8 = 0;
        do {
          local_60 = (double)(**(code **)((long)*pu + 0x120))(pu,uVar8,lastJAI,uVar6,local_6c);
          dVar9 = (double)(**(code **)(*plVar7 + 0x10))(plVar7,uVar8,lastJAI,uVar6);
          auVar15._8_8_ = 0;
          auVar15._0_8_ =
               *(ulong *)(*(long *)(&this->field_0x10 + *(long *)(*(long *)this + -0xd8)) +
                         uVar8 * 8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_80;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = dVar9 * local_60;
          auVar11 = vfmadd213sd_fma(auVar15,auVar10,auVar1);
          local_80 = auVar11._0_8_;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (uVar8 < local_68);
      }
      if (iStack_50._M_current == local_48) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_58,iStack_50,&local_80);
      }
      else {
        *iStack_50._M_current = local_80;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      local_78 = local_78 + local_80;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (uVar6 < local_68);
    goto LAB_003f8f45;
  }
  local_78 = 0.0;
LAB_003f8f45:
  if ((0.0 < local_78) && (local_68 != 0)) {
    lVar4 = *(long *)this;
    uVar6 = 0;
    do {
      *(double *)(*(long *)(&this->field_0x10 + *(long *)(lVar4 + -0xd8)) + uVar6 * 8) =
           *(double *)((long)local_58 + uVar6 * 8) / local_78;
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < local_68);
  }
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 8))(plVar7);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return local_78;
}

Assistant:

double JointBelief::Update(const MultiAgentDecisionProcessDiscreteInterface &pu,
                           Index lastJAI, Index newJOI)
{
    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    vector<double> newJB_unnorm;
    size_t nrS = pu.GetNrStates();
    
    TGet* T = 0;
    T = pu.GetTGet();
    if(T != 0)
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                    Ps_ba += T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                //Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                //_m_b[prec_sI];

                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * T->Get(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
    }
    else 
    {
        for(Index sI=0; sI < nrS; sI++)
        {
            double Pso_ba = 0.0;
            if(!pu.GetEventObservability())
            {
                //P(newJOI | lastJAI, sI) :
                double Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);
                //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
                double Ps_ba = 0.0;
                //for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //Ps_ba += T->Get(it.index(), lastJAI, sI) * *it;
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                  Ps_ba += pu.GetTransitionProbability(prec_sI, lastJAI, sI) * 
                    _m_b[prec_sI];
                
                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
            else
            {
                for(Index prec_sI=0; prec_sI < nrS; prec_sI++)
                {
                    //P(newJOI | prec_sI, lastJAI, sI) :
                    double Po_sas = pu.GetObservationProbability(prec_sI, lastJAI, sI, newJOI);
                    //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                    Pso_ba += Po_sas * pu.GetTransitionProbability(prec_sI, lastJAI, sI) * _m_b[prec_sI];
                }
            }                
            newJB_unnorm.push_back(Pso_ba); //unormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
        //throw E("JointBelief::Update tried to obtain a TGet, but apparently the transition model is not cached? (it should be, since this belief update loops over all states it should be possible to cache the transition model)");
    }
   
    //normalize:
    if(Po_ba>0)
        for(Index sI=0; sI < nrS; sI++)
            _m_b[sI]=newJB_unnorm[sI]/Po_ba;

    delete T;

#if JointBelief_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBelief::Update SanityCheck failed"));
#endif

    return(Po_ba);
}